

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O2

void __thiscall DifferentialEquation::~DifferentialEquation(DifferentialEquation *this)

{
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DifferentialEquation_00154928;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__DifferentialEquation_001549b8;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__DifferentialEquation_00154a00;
  std::_Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::~_Vector_base
            (&(this->eqnIntegrators).
              super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>);
  std::_Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::~_Vector_base
            (&(this->eqnIntegrands).
              super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>);
  StochasticProcess::~StochasticProcess((StochasticProcess *)this);
  return;
}

Assistant:

DifferentialEquation::~DifferentialEquation()
{
}